

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

void emit_string(char *str,FILE *out)

{
  ushort **ppuVar1;
  FILE *out_local;
  char *str_local;
  
  for (out_local = (FILE *)str; (char)out_local->_flags != '\0';
      out_local = (FILE *)((long)&out_local->_flags + 1)) {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)(uint)(byte)out_local->_flags] & 0x8000) == 0) {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)(uint)(byte)out_local->_flags] & 0x2000) == 0) {
        fprintf((FILE *)out,"\\%.3o",(ulong)(uint)(int)(char)out_local->_flags);
      }
      else {
        putc(0x5f,(FILE *)out);
      }
    }
    else {
      putc((int)(char)out_local->_flags,(FILE *)out);
    }
  }
  return;
}

Assistant:

static void
emit_string(const char *str, FILE *out)
   /* Print a string with spaces replaced by '_' and non-printing characters by
    * an octal escape.
    */
{
   for (; *str; ++str)
      if (isgraph(UCHAR_MAX & *str))
         putc(*str, out);

      else if (isspace(UCHAR_MAX & *str))
         putc('_', out);

      else
         fprintf(out, "\\%.3o", *str);
}